

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O0

void PopIStackUntil(TidyDocImpl *doc,TidyTagId tid)

{
  Lexer *pLVar1;
  IStack *istack;
  Lexer *lexer;
  TidyTagId tid_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  do {
    if (pLVar1->istacksize == 0) {
      return;
    }
    PopIStack(doc);
  } while ((pLVar1->istack[pLVar1->istacksize].tag)->id != tid);
  return;
}

Assistant:

static void PopIStackUntil( TidyDocImpl* doc, TidyTagId tid )
{
    Lexer* lexer = doc->lexer;
    IStack *istack;

    while (lexer->istacksize > 0)
    {
        PopIStack( doc );
        istack = &(lexer->istack[lexer->istacksize]);
        if ( istack->tag->id == tid )
            break;
    }
}